

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O2

void cconv_err_conv(CTState *cts,CType *d,CType *s,CTInfo flags)

{
  GCstr *pGVar1;
  GCstr *pGVar2;
  ulong uVar3;
  
  pGVar1 = lj_ctype_repr(cts->L,(CTypeID)((ulong)((long)d - (long)cts->tab) >> 4),(GCstr *)0x0);
  if ((flags & 2) == 0) {
    pGVar2 = lj_ctype_repr(cts->L,(CTypeID)((ulong)((long)s - (long)cts->tab) >> 4),(GCstr *)0x0);
    pGVar2 = pGVar2 + 1;
  }
  else {
    uVar3 = 4;
    if (0xfffffff < s->info) {
      uVar3 = (ulong)((uint)((s->info & 0xf0000000) == 0x30000000) * 4 + 1);
    }
    pGVar2 = (GCstr *)lj_obj_typename[uVar3];
  }
  if (flags < 0x100) {
    lj_err_callerv(cts->L,LJ_ERR_FFI_BADCONV,pGVar2,pGVar1 + 1);
  }
  lj_err_argv(cts->L,flags >> 8,LJ_ERR_FFI_BADCONV,pGVar2,pGVar1 + 1);
}

Assistant:

LJ_NORET static void cconv_err_conv(CTState *cts, CType *d, CType *s,
				    CTInfo flags)
{
  const char *dst = strdata(lj_ctype_repr(cts->L, ctype_typeid(cts, d), NULL));
  const char *src;
  if ((flags & CCF_FROMTV))
    src = lj_obj_typename[1+(ctype_isnum(s->info) ? LUA_TNUMBER :
			     ctype_isarray(s->info) ? LUA_TSTRING : LUA_TNIL)];
  else
    src = strdata(lj_ctype_repr(cts->L, ctype_typeid(cts, s), NULL));
  if (CCF_GETARG(flags))
    lj_err_argv(cts->L, CCF_GETARG(flags), LJ_ERR_FFI_BADCONV, src, dst);
  else
    lj_err_callerv(cts->L, LJ_ERR_FFI_BADCONV, src, dst);
}